

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O3

bool __thiscall lunasvg::SVGPoint::parse(SVGPoint *this,string_view input)

{
  byte *pbVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  byte *pbVar5;
  long lVar6;
  string_view local_20;
  undefined8 local_10;
  
  pbVar5 = (byte *)input._M_str;
  local_20._M_len = input._M_len;
  local_10 = 0;
  local_20._M_str = (char *)pbVar5;
  if (local_20._M_len != 0) {
    pbVar1 = pbVar5 + local_20._M_len;
    lVar3 = -local_20._M_len;
    do {
      if ((0x20 < (ulong)(byte)*local_20._M_str) ||
         ((0x100002600U >> ((ulong)(byte)*local_20._M_str & 0x3f) & 1) == 0)) {
        lVar6 = 0;
        goto LAB_0011fa9c;
      }
      local_20._M_str = (char *)((byte *)local_20._M_str + 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    local_20._M_len = 0;
    local_20._M_str = (char *)pbVar1;
  }
  goto LAB_0011fac5;
  while (bVar2 = lVar3 + 1 != lVar6, lVar6 = lVar6 + -1, bVar2) {
LAB_0011fa9c:
    if ((0x20 < (ulong)pbVar5[lVar6 + (local_20._M_len - 1)]) ||
       ((0x100002600U >> ((ulong)pbVar5[lVar6 + (local_20._M_len - 1)] & 0x3f) & 1) == 0)) {
      local_20._M_len = lVar6 - lVar3;
      goto LAB_0011fac5;
    }
  }
  local_20._M_len = 0;
LAB_0011fac5:
  bVar2 = parseNumber<float>(&local_20,(float *)&local_10);
  if ((bVar2) && (local_20._M_len != 0)) {
    do {
      sVar4 = local_20._M_len - 1;
      if ((0x20 < (ulong)(byte)*local_20._M_str) ||
         ((0x100002600U >> ((ulong)(byte)*local_20._M_str & 0x3f) & 1) == 0)) {
        bVar2 = parseNumber<float>(&local_20,(float *)((long)&local_10 + 4));
        if (!bVar2) {
          return false;
        }
        if (local_20._M_len != 0) {
          return false;
        }
        *(undefined8 *)&(this->super_SVGProperty).field_0xc = local_10;
        return true;
      }
      local_20._M_len = sVar4;
      local_20._M_str = local_20._M_str + 1;
    } while (sVar4 != 0);
  }
  return false;
}

Assistant:

bool SVGPoint::parse(std::string_view input)
{
    Point value;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value.x)
        || !skipOptionalSpaces(input)
        || !parseNumber(input, value.y)
        || !input.empty()) {
        return false;
    }

    m_value = value;
    return true;
}